

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

bool __thiscall MlmWrap::init_hardware_connection(MlmWrap *this)

{
  network_pimpl *pnVar1;
  _Bool _Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  zsock_t *pzVar6;
  char *pcVar7;
  string *psVar8;
  string h_address;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((this->hardwaresock == (zsock_t *)0x0) || (_Var2 = zsock_is(this->hardwaresock), !_Var2)) {
    std::__cxx11::string::string((string *)&h_address,(string *)&this->state->hardware_endpoint);
    if (h_address._M_string_length == 0) {
      bVar3 = std::operator!=(&this->id,"Trodes");
      std::__cxx11::string::~string((string *)&h_address);
      if (bVar3) {
        std::__cxx11::string::string
                  ((string *)&local_60,"Hardware socket not initialized by Trodes yet\n",
                   (allocator *)&local_160);
        error(&h_address,this,&local_60);
        std::operator<<((ostream *)&std::cerr,(string *)&h_address);
        std::__cxx11::string::~string((string *)&h_address);
        psVar8 = &local_60;
        goto LAB_00198b9f;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&h_address);
    }
    psVar8 = &this->id;
    bVar3 = std::operator==(psVar8,"temp");
    if ((bVar3) || (bVar3 = std::operator==(psVar8,"Broker"), bVar3)) {
      std::__cxx11::string::string
                ((string *)&local_80,"Error initializing hardware connection. ",
                 (allocator *)&local_160);
      error(&h_address,this,&local_80);
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&h_address);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      std::operator<<(poVar5," cannot speak to hardware!\n");
      std::__cxx11::string::~string((string *)&h_address);
      psVar8 = &local_80;
    }
    else {
      bVar3 = std::operator==(psVar8,"Trodes");
      if (bVar3) {
        pzVar6 = zsock_new_checked(6,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/networkincludes.cpp"
                                   ,0x4c9);
        this->hardwaresock = pzVar6;
        if (pzVar6 != (zsock_t *)0x0) {
          std::__cxx11::string::string((string *)&h_address,(string *)&this->state->address);
          pzVar6 = this->hardwaresock;
          std::operator+(&local_c0,&h_address,":*[");
          std::__cxx11::to_string(&local_e0,this->state->port + 1);
          std::operator+(&local_140,&local_c0,&local_e0);
          std::operator+(&local_160,&local_140,"-]");
          iVar4 = zsock_bind(pzVar6,"%s",local_160._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_c0);
          if (iVar4 < 0) {
            std::__cxx11::string::string
                      ((string *)&local_100,"Error initializing Trodes hardware socket\n",
                       (allocator *)&local_140);
            error(&local_160,this,&local_100);
            std::operator<<((ostream *)&std::cerr,(string *)&local_160);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_100);
          }
          else {
            std::__cxx11::string::_M_assign((string *)&this->state->hardware_address);
            pnVar1 = this->state;
            pnVar1->hardware_port = iVar4;
            pcVar7 = zsock_endpoint(this->hardwaresock);
            std::__cxx11::string::string((string *)&local_160,pcVar7,(allocator *)&local_140);
            std::__cxx11::string::_M_assign((string *)&pnVar1->hardware_endpoint);
            std::__cxx11::string::~string((string *)&local_160);
            std::mutex::lock(&this->actormutex);
            zstr_send(this->actor,"addhsock");
            pthread_mutex_unlock((pthread_mutex_t *)&this->actormutex);
          }
          std::__cxx11::string::~string((string *)&h_address);
          if (iVar4 < 0) {
            return false;
          }
          return true;
        }
        std::__cxx11::string::string
                  ((string *)&local_a0,"Error creating hardware router socket\n",
                   (allocator *)&local_160);
        error(&h_address,this,&local_a0);
        std::operator<<((ostream *)&std::cerr,(string *)&h_address);
        std::__cxx11::string::~string((string *)&h_address);
        psVar8 = &local_a0;
      }
      else {
        pzVar6 = zsock_new_checked(3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/networkincludes.cpp"
                                   ,0x4e1);
        this->hardwaresock = pzVar6;
        zsock_set_identity(pzVar6,(this->id)._M_dataplus._M_p);
        pzVar6 = this->hardwaresock;
        std::__cxx11::string::string((string *)&h_address,(string *)&this->state->hardware_endpoint)
        ;
        zsock_connect(pzVar6,"%s",h_address._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&h_address);
        if (this->hardwaresock != (zsock_t *)0x0) {
          return true;
        }
        std::__cxx11::string::string
                  ((string *)&local_120,"Error creating hardware router socket at ",
                   (allocator *)&local_140);
        error(&h_address,this,&local_120);
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&h_address);
        std::__cxx11::string::string((string *)&local_160,(string *)&this->state->hardware_endpoint)
        ;
        poVar5 = std::operator<<(poVar5,(string *)&local_160);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&h_address);
        psVar8 = &local_120;
      }
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_40,"Hardware socket already initialized!\n",(allocator *)&local_160)
    ;
    error(&h_address,this,&local_40);
    std::operator<<((ostream *)&std::cerr,(string *)&h_address);
    std::__cxx11::string::~string((string *)&h_address);
    psVar8 = &local_40;
  }
LAB_00198b9f:
  std::__cxx11::string::~string((string *)psVar8);
  return false;
}

Assistant:

bool MlmWrap::init_hardware_connection(){
    if(hardwaresock != NULL && zsock_is(hardwaresock)){
        std::cerr << error("Hardware socket already initialized!\n");
        return false;
    }

    if(state->getHardware_endpoint().empty() && id != TRODES_NETWORK_ID){
        std::cerr << error("Hardware socket not initialized by Trodes yet\n");
        return false;
    }

    if(id == TEMP_NETWORK_ID || id == BROKER_NETWORK_ID){
        std::cerr << error("Error initializing hardware connection. ") << id << " cannot speak to hardware!\n";
        return false;
    }

    if(id == TRODES_NETWORK_ID){
    //1. create socket
        hardwaresock = zsock_new(ZMQ_ROUTER);
        if(hardwaresock == NULL){
            std::cerr << error("Error creating hardware router socket\n");
            return false;
        }
        std::string h_address = state->getAddress();
        int h_port = zsock_bind(hardwaresock, "%s", std::string(h_address + ":*[" +
                       std::to_string(state->getPort()+1) + "-]").c_str());
        if(h_port < 0){
            std::cerr << error("Error initializing Trodes hardware socket\n");
            return false;
        }

    //2. update state
        state->setHardware_address(h_address);
        state->setHardware_port(h_port);
        state->setHardware_endpoint(zsock_endpoint(hardwaresock));

    //3. add hardwaresock to zloop so that it can be handled automatically
        std::lock_guard<std::mutex> lock(actormutex);
        zstr_send(actor, addhsock);
    }
    else{
    //1. use the trodes hardware router socket address and connect (get from hardware state)
        hardwaresock = zsock_new(ZMQ_REQ);
        zsock_set_identity(hardwaresock, id.c_str());
        zsock_connect(hardwaresock, "%s", state->getHardware_endpoint().c_str());
        if(hardwaresock == NULL){
            std::cerr << error("Error creating hardware router socket at ") << state->getHardware_endpoint() << "\n";
            return false;
        }
    }
    return true;
}